

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.cpp
# Opt level: O0

bool SanityTest(pfHash hash,int hashbits)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  void *__s;
  void *__s_00;
  void *__dest;
  int in_ESI;
  code *in_RDI;
  int i_1;
  int i;
  int bit;
  uint8_t *key2;
  uint8_t *key1;
  int offset;
  int len;
  int irep;
  uint8_t *hash2;
  uint8_t *hash1;
  uint8_t *buffer2;
  uint8_t *buffer1;
  int buflen;
  int pad;
  int keymax;
  int reps;
  int hashbytes;
  bool result;
  Rand r;
  undefined8 in_stack_ffffffffffffff58;
  Rand *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  uint uVar6;
  uint32_t in_stack_ffffffffffffff84;
  int local_64;
  int local_60;
  int local_5c;
  
  printf("Running sanity check 1     ");
  Rand::Rand(in_stack_ffffffffffffff60,(uint32_t)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  bVar1 = true;
  iVar2 = in_ESI / 8;
  pvVar4 = operator_new__(0x130);
  pvVar5 = operator_new__(0x130);
  __s = operator_new__((long)iVar2);
  __s_00 = operator_new__((long)iVar2);
  memset(__s,1,(long)iVar2);
  memset(__s_00,2,(long)iVar2);
  for (local_5c = 0; local_5c < 10; local_5c = local_5c + 1) {
    if (local_5c % 1 == 0) {
      printf(".");
    }
    for (local_60 = 4; local_60 < 0x101; local_60 = local_60 + 1) {
      for (local_64 = 0x10; local_64 < 0x20; local_64 = local_64 + 1) {
        __dest = (void *)((long)pvVar5 + (long)(local_64 + 0x10));
        Rand::rand_p((Rand *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
        Rand::rand_p((Rand *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
        memcpy(__dest,(void *)((long)pvVar4 + 0x10),(long)local_60);
        (*in_RDI)((void *)((long)pvVar4 + 0x10),local_60,0,__s);
        for (in_stack_ffffffffffffff84 = 0; (int)in_stack_ffffffffffffff84 < local_60 * 8;
            in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 + 1) {
          flipbit(__dest,local_60,in_stack_ffffffffffffff84);
          (*in_RDI)(__dest,local_60,0,__s_00);
          iVar3 = memcmp(__s,__s_00,(long)iVar2);
          if (iVar3 == 0) {
            uVar6 = 0;
            goto LAB_001b1b82;
          }
          flipbit(__dest,local_60,in_stack_ffffffffffffff84);
          (*in_RDI)(__dest,local_60,0,__s_00);
          iVar3 = memcmp(__s,__s_00,(long)iVar2);
          if (iVar3 != 0) {
            uVar6 = 0;
            goto LAB_001b1c4b;
          }
        }
      }
    }
  }
LAB_001b1d0b:
  if (bVar1 == false) {
    printf(" FAIL  !!!!!\n");
  }
  else {
    printf(" PASS\n");
  }
  if (pvVar4 != (void *)0x0) {
    operator_delete__(pvVar4);
  }
  if (pvVar5 != (void *)0x0) {
    operator_delete__(pvVar5);
  }
  if (__s != (void *)0x0) {
    operator_delete__(__s);
  }
  if (__s_00 != (void *)0x0) {
    operator_delete__(__s_00);
  }
  return bVar1;
LAB_001b1b82:
  if (iVar2 <= (int)uVar6) goto LAB_001b1bee;
  if (*(char *)((long)__s + (long)(int)uVar6) == *(char *)((long)__s_00 + (long)(int)uVar6)) {
    printf(" %d: 0x%02X == 0x%02X ",(ulong)uVar6,(ulong)*(byte *)((long)__s + (long)(int)uVar6),
           (ulong)*(byte *)((long)__s_00 + (long)(int)uVar6));
    goto LAB_001b1bee;
  }
  uVar6 = uVar6 + 1;
  goto LAB_001b1b82;
LAB_001b1bee:
  bVar1 = false;
  goto LAB_001b1d0b;
LAB_001b1c4b:
  if (iVar2 <= (int)uVar6) goto LAB_001b1cb7;
  if (*(char *)((long)__s + (long)(int)uVar6) != *(char *)((long)__s_00 + (long)(int)uVar6)) {
    printf(" %d: 0x%02X != 0x%02X ",(ulong)uVar6,(ulong)*(byte *)((long)__s + (long)(int)uVar6),
           (ulong)*(byte *)((long)__s_00 + (long)(int)uVar6));
    goto LAB_001b1cb7;
  }
  uVar6 = uVar6 + 1;
  goto LAB_001b1c4b;
LAB_001b1cb7:
  bVar1 = false;
  goto LAB_001b1d0b;
}

Assistant:

bool SanityTest ( pfHash hash, const int hashbits )
{
  printf("Running sanity check 1     ");

  Rand r(883741);

  bool result = true;

  const int hashbytes = hashbits/8;
  const int reps = 10;
  const int keymax = 256;
  const int pad = 16;
  const int buflen = keymax + pad*3;

  uint8_t * buffer1 = new uint8_t[buflen];
  uint8_t * buffer2 = new uint8_t[buflen];

  uint8_t * hash1 = new uint8_t[hashbytes];
  uint8_t * hash2 = new uint8_t[hashbytes];

  //----------
  memset(hash1, 1, hashbytes);
  memset(hash2, 2, hashbytes);
  
  for(int irep = 0; irep < reps; irep++)
  {
    if(irep % (reps/10) == 0) printf(".");

    for(int len = 4; len <= keymax; len++)
    {
      for(int offset = pad; offset < pad*2; offset++)
      {
        uint8_t * key1 = &buffer1[pad];
        uint8_t * key2 = &buffer2[pad+offset];

        r.rand_p(buffer1,buflen);
        r.rand_p(buffer2,buflen);

        memcpy(key2,key1,len);

        hash(key1,len,0,hash1);

        for(int bit = 0; bit < (len * 8); bit++)
        {
          // Flip a bit, hash the key -> we should get a different result.

          flipbit(key2,len,bit);
          hash(key2,len,0,hash2);

          if(memcmp(hash1,hash2,hashbytes) == 0)
            {
              for(int i=0; i < hashbytes; i++){
                if (hash1[i] == hash2[i]) {
                  printf(" %d: 0x%02X == 0x%02X ", i, hash1[i], hash2[i]);
                  break;
                }
              }
              result = false;
              goto end_sanity;
            }

          // Flip it back, hash again -> we should get the original result.

          flipbit(key2,len,bit);
          hash(key2,len,0,hash2);

          if(memcmp(hash1,hash2,hashbytes) != 0)
            {
              for(int i=0; i < hashbytes; i++){
                if (hash1[i] != hash2[i]) {
                  printf(" %d: 0x%02X != 0x%02X ", i, hash1[i], hash2[i]);
                  break;
                }
              }
              result = false;
              goto end_sanity;
            }
        }
      }
    }
  }

 end_sanity:
  if(result == false)
  {
    printf(" FAIL  !!!!!\n");
  }
  else
  {
    printf(" PASS\n");
  }

  delete [] buffer1;
  delete [] buffer2;

  delete [] hash1;
  delete [] hash2;

  return result;
}